

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

char * gguf_get_key(gguf_context *ctx,int64_t key_id)

{
  pointer in_RAX;
  long lVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if ((-1 < key_id) &&
     (in_RAX = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
               super__Vector_impl_data._M_start,
     lVar1 = ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)in_RAX >> 3) * 0x2e8ba2e8ba2e8ba3,
     lVar1 - key_id != 0 && key_id <= lVar1)) {
    return in_RAX[key_id].key._M_dataplus._M_p;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
             ,0x2fb,"GGML_ASSERT(%s) failed","key_id >= 0 && key_id < gguf_get_n_kv(ctx)",in_R8,
             in_R9,in_RAX);
}

Assistant:

const char * gguf_get_key(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    return ctx->kv[key_id].get_key().c_str();
}